

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

bool anon_unknown.dwarf_4f3212::TraceEnableModeHelper
               (optional<cmCMakePresetsGraph::TraceEnableMode> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  TraceEnableMode local_bc;
  ValueHolder local_b8;
  String local_b0;
  TraceEnableMode local_8c;
  ValueHolder local_88;
  String local_80;
  TraceEnableMode local_5c;
  ValueHolder local_58;
  String local_50;
  cmJSONState *local_28;
  cmJSONState *state_local;
  Value *value_local;
  optional<cmCMakePresetsGraph::TraceEnableMode> *out_local;
  
  local_28 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (value == (Value *)0x0) {
    std::optional<cmCMakePresetsGraph::TraceEnableMode>::operator=(out);
    out_local._7_1_ = true;
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      Json::Value::asString_abi_cxx11_(&local_50,(Value *)state_local);
      bVar1 = std::operator==(&local_50,"on");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        local_5c = Default;
        std::optional<cmCMakePresetsGraph::TraceEnableMode>::
        optional<cmCMakePresetsGraph::TraceEnableMode,_true>
                  ((optional<cmCMakePresetsGraph::TraceEnableMode> *)&local_58,&local_5c);
        value_local->value_ = local_58;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_80,(Value *)state_local);
        bVar1 = std::operator==(&local_80,"off");
        std::__cxx11::string::~string((string *)&local_80);
        if (bVar1) {
          local_8c = Disable;
          std::optional<cmCMakePresetsGraph::TraceEnableMode>::
          optional<cmCMakePresetsGraph::TraceEnableMode,_true>
                    ((optional<cmCMakePresetsGraph::TraceEnableMode> *)&local_88,&local_8c);
          value_local->value_ = local_88;
        }
        else {
          Json::Value::asString_abi_cxx11_(&local_b0,(Value *)state_local);
          bVar1 = std::operator==(&local_b0,"expand");
          std::__cxx11::string::~string((string *)&local_b0);
          if (!bVar1) {
            cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
            return false;
          }
          local_bc = Expand;
          std::optional<cmCMakePresetsGraph::TraceEnableMode>::
          optional<cmCMakePresetsGraph::TraceEnableMode,_true>
                    ((optional<cmCMakePresetsGraph::TraceEnableMode> *)&local_b8,&local_bc);
          value_local->value_ = local_b8;
        }
      }
      out_local._7_1_ = true;
    }
    else {
      cmCMakePresetsErrors::INVALID_PRESET((Value *)state_local,local_28);
      out_local._7_1_ = false;
    }
  }
  return out_local._7_1_;
}

Assistant:

bool TraceEnableModeHelper(cm::optional<TraceEnableMode>& out,
                           const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (!value->isString()) {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  if (value->asString() == "on") {
    out = TraceEnableMode::Default;
  } else if (value->asString() == "off") {
    out = TraceEnableMode::Disable;
  } else if (value->asString() == "expand") {
    out = TraceEnableMode::Expand;
  } else {
    cmCMakePresetsErrors::INVALID_PRESET(value, state);
    return false;
  }

  return true;
}